

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

char * Pm_GetErrorText(PmError errnum)

{
  switch(errnum) {
  case pmHostError:
    return "PortMidi: `Host error\'";
  case pmInvalidDeviceId:
    return "PortMidi: `Invalid device ID\'";
  case pmInsufficientMemory:
    return "PortMidi: `Insufficient memory\'";
  case pmBufferTooSmall:
    return "PortMidi: `Buffer too small\'";
  case pmBufferOverflow:
    return "PortMidi: `Buffer overflow\'";
  case pmBadPtr:
    return "PortMidi: `Bad pointer\'";
  case pmBadData:
    return "PortMidi: `Invalid MIDI message Data\'";
  case pmInternalError:
    return "PortMidi: `Internal PortMidi Error\'";
  case pmBufferMaxSize:
    return "PortMidi: `Buffer cannot be made larger\'";
  }
  if (errnum != pmNoData) {
    return "PortMidi: `Illegal error number\'";
  }
  return "";
}

Assistant:

PMEXPORT const char *Pm_GetErrorText( PmError errnum ) {
    const char *msg;

    switch(errnum)
    {
    case pmNoError:                  
        msg = ""; 
        break;
    case pmHostError:                
        msg = "PortMidi: `Host error'"; 
        break;
    case pmInvalidDeviceId:          
        msg = "PortMidi: `Invalid device ID'"; 
        break;
    case pmInsufficientMemory:       
        msg = "PortMidi: `Insufficient memory'"; 
        break;
    case pmBufferTooSmall:           
        msg = "PortMidi: `Buffer too small'"; 
        break;
    case pmBadPtr:                   
        msg = "PortMidi: `Bad pointer'"; 
        break;
    case pmInternalError:            
        msg = "PortMidi: `Internal PortMidi Error'"; 
        break;
    case pmBufferOverflow:
        msg = "PortMidi: `Buffer overflow'";
        break;
    case pmBadData:
        msg = "PortMidi: `Invalid MIDI message Data'";
        break;
    case pmBufferMaxSize:
        msg = "PortMidi: `Buffer cannot be made larger'";
        break;
    default:                         
        msg = "PortMidi: `Illegal error number'"; 
        break;
    }
    return msg;
}